

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts::~TensorValue_RepeatedLongInts
          (TensorValue_RepeatedLongInts *this)

{
  Arena *pAVar1;
  TensorValue_RepeatedLongInts *this_local;
  
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (pAVar1 == (Arena *)0x0) {
    SharedDtor(this);
    google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_);
  }
  google::protobuf::RepeatedField<long>::~RepeatedField(&this->values_);
  google::protobuf::MessageLite::~MessageLite(&this->super_MessageLite);
  return;
}

Assistant:

TensorValue_RepeatedLongInts::~TensorValue_RepeatedLongInts() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}